

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

void Gia_ManAreRebalance(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  int iVar1;
  int iVar2;
  Gia_PtrAre_t GVar3;
  uint uVar4;
  Gia_PtrAre_t GVar5;
  uint *puVar6;
  uint uVar7;
  uint *puVar8;
  
  if (((uint)*pRoot & 0x7fffffff) == 0) {
    __assert_fail("pRoot->nItem || pRoot->nPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x38c,"void Gia_ManAreRebalance(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  iVar1 = p->nObjs;
  iVar2 = p->nObjPages;
  if (iVar1 == iVar2 << 0x14) {
    if (iVar2 == 0x800) {
      puts("ERA manager has run out of memory after allocating 2B internal nodes.");
      puVar6 = (uint *)0x0;
      goto LAB_0072b2e0;
    }
    puVar6 = (uint *)calloc(0x400000,4);
    p->nObjPages = iVar2 + 1;
    p->ppObjs[iVar2] = puVar6;
    if (iVar1 == 0) {
      p->nObjs = 1;
    }
  }
  uVar4 = p->nObjs;
  p->nObjs = uVar4 + 1;
  puVar6 = (uint *)((ulong)((uVar4 & 0xfffff) << 4) +
                   *(long *)((long)p->ppObjs + (ulong)(uVar4 >> 0x11 & 0x3ff8)));
LAB_0072b2e0:
  uVar4 = Gia_ManAreFindBestVar(p,*pRoot);
  *puVar6 = *puVar6 & 0xffffc000 | uVar4 & 0x3fff;
  GVar5 = *pRoot;
  puVar8 = (uint *)((long)p->nSize * (ulong)((uint)GVar5 & 0xfffff) * 4 +
                   *(long *)((long)p->ppStas + (ulong)((uint)GVar5 >> 0x11 & 0x3ff8)));
  if (*p->ppStas != puVar8) {
    do {
      GVar3 = *(Gia_PtrAre_t *)(puVar8 + 1);
      if (-1 < (int)*puVar8) {
        uVar4 = *(uint *)((long)puVar8 + (ulong)(*puVar6 >> 2 & 0xffc) + 8);
        uVar7 = *puVar6 * 2 & 0x1e;
        if ((uVar4 >> uVar7 & 1) == 0) {
          if ((uVar4 >> (sbyte)uVar7 & 2) != 0) {
            puVar8[1] = puVar6[2];
            *(Gia_PtrAre_t *)(puVar6 + 2) = GVar5;
            uVar7 = *puVar6 + 0x100000 & 0x3f00000;
            uVar4 = *puVar6 & 0xfc0fffff;
            goto LAB_0072b3a8;
          }
          puVar8[1] = puVar6[3];
          *(Gia_PtrAre_t *)(puVar6 + 3) = GVar5;
          uVar4 = *puVar6 + 0x4000000;
        }
        else {
          puVar8[1] = puVar6[1];
          *(Gia_PtrAre_t *)(puVar6 + 1) = GVar5;
          uVar7 = *puVar6 + 0x4000 & 0xfc000;
          uVar4 = *puVar6 & 0xfff03fff;
LAB_0072b3a8:
          uVar4 = uVar4 | uVar7;
        }
        *puVar6 = uVar4;
      }
      puVar8 = (uint *)((long)p->nSize * (ulong)((uint)GVar3 & 0xfffff) * 4 +
                       *(long *)((long)p->ppStas + (ulong)((uint)GVar3 >> 0x11 & 0x3ff8)));
      GVar5 = GVar3;
    } while (*p->ppStas != puVar8);
  }
  GVar5 = (Gia_PtrAre_t)(p->nObjs - 1);
  *pRoot = GVar5;
  if (puVar6 != (uint *)((ulong)(((uint)GVar5 & 0xfffff) << 4) +
                        *(long *)((long)p->ppObjs + (ulong)((uint)GVar5 >> 0x11 & 0x3ff8)))) {
    __assert_fail("pNode == Gia_ManAreObj(p, *pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x39d,"void Gia_ManAreRebalance(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  p->fTree = 1;
  return;
}

Assistant:

static inline void Gia_ManAreRebalance( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_ObjAre_t * pNode;
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pNode = Gia_ManAreCreateObj( p );
    pNode->iVar = Gia_ManAreFindBestVar( p, *pRoot );
    for ( iCube = *pRoot, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext,  pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        if ( Gia_StaHasValue0(pCube, pNode->iVar) )
            pCube->iNext = pNode->F[0], pNode->F[0] = iCube, pNode->nStas0++;
        else if ( Gia_StaHasValue1(pCube, pNode->iVar) )
            pCube->iNext = pNode->F[1], pNode->F[1] = iCube, pNode->nStas1++;
        else
            pCube->iNext = pNode->F[2], pNode->F[2] = iCube, pNode->nStas2++;
    }
    *pRoot = Gia_Int2Ptr(p->nObjs - 1);
    assert( pNode == Gia_ManAreObj(p, *pRoot) );
    p->fTree = 1;
}